

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_pstream.c
# Opt level: O0

void HTS_PStream_ldl_factorization(HTS_PStream *pst)

{
  double *pdVar1;
  size_t j;
  size_t i;
  size_t t;
  HTS_PStream *pst_local;
  
  for (t = 0; t < pst->length; t = t + 1) {
    for (i = 1; i < pst->width && i <= t; i = i + 1) {
      pdVar1 = (pst->sm).wuw[t];
      *pdVar1 = -((pst->sm).wuw[t - i][i] * (pst->sm).wuw[t - i][i]) * *(pst->sm).wuw[t - i] +
                *pdVar1;
    }
    for (i = 1; i < pst->width; i = i + 1) {
      for (j = 1; i + j < pst->width && j <= t; j = j + 1) {
        pdVar1 = (pst->sm).wuw[t];
        pdVar1[i] = -((pst->sm).wuw[t - j][j] * (pst->sm).wuw[t - j][i + j]) * *(pst->sm).wuw[t - j]
                    + pdVar1[i];
      }
      pdVar1 = (pst->sm).wuw[t];
      pdVar1[i] = pdVar1[i] / *(pst->sm).wuw[t];
    }
  }
  return;
}

Assistant:

static void HTS_PStream_ldl_factorization(HTS_PStream * pst)
{
   size_t t, i, j;

   for (t = 0; t < pst->length; t++) {
      for (i = 1; (i < pst->width) && (t >= i); i++)
         pst->sm.wuw[t][0] -= pst->sm.wuw[t - i][i] * pst->sm.wuw[t - i][i] * pst->sm.wuw[t - i][0];

      for (i = 1; i < pst->width; i++) {
         for (j = 1; (i + j < pst->width) && (t >= j); j++)
            pst->sm.wuw[t][i] -= pst->sm.wuw[t - j][j] * pst->sm.wuw[t - j][i + j] * pst->sm.wuw[t - j][0];
         pst->sm.wuw[t][i] /= pst->sm.wuw[t][0];
      }
   }
}